

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::UnlockStringArray(ACSStringPool *this,int *strnum,uint count)

{
  uint uVar1;
  uint uVar2;
  PoolEntry *pPVar3;
  ulong uVar4;
  uint uVar5;
  
  if (count != 0) {
    uVar1 = (this->Pool).Count;
    pPVar3 = (this->Pool).Array;
    uVar4 = 0;
    do {
      if (((strnum[uVar4] & 0xfff00000U) == 0x7ff00000) &&
         (uVar5 = strnum[uVar4] & 0xfffff, uVar5 < uVar1)) {
        uVar2 = pPVar3[uVar5].LockCount;
        if (uVar2 == 0) {
          __assert_fail("Pool[num].LockCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                        ,0x204,"void ACSStringPool::UnlockStringArray(const int *, unsigned int)");
        }
        pPVar3[uVar5].LockCount = uVar2 - 1;
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  return;
}

Assistant:

void ACSStringPool::UnlockStringArray(const int *strnum, unsigned int count)
{
	for (unsigned int i = 0; i < count; ++i)
	{
		int num = strnum[i];
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				assert(Pool[num].LockCount > 0);
				Pool[num].LockCount--;
			}
		}
	}
}